

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O0

int dog_move(monst *mtmp,int after)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  boolean bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  obj *poVar15;
  trap *ptVar16;
  char *pcVar17;
  int local_134;
  monst *local_130;
  edog *local_128;
  coord local_112;
  obj *poStack_110;
  coord cc;
  obj *mw_tmp;
  trap *trap;
  monst *mtmp2;
  int mstatus;
  coord mm;
  long allowflags;
  long info [9];
  coord local_98 [4];
  coord poss [9];
  int local_74;
  int ndist;
  int nidist;
  int chi;
  xchar chcnt;
  xchar uncursedcnt;
  xchar cnt;
  int ny;
  int nx;
  xchar niy;
  xchar nix;
  boolean do_eat;
  boolean cursemsg [9];
  boolean has_edog;
  xchar otyp;
  obj *obj;
  edog *edog;
  int local_38;
  int k;
  int j;
  int i;
  int udist;
  int whappr;
  int appr;
  int omy;
  int omx;
  int after_local;
  monst *mtmp_local;
  
  local_128 = (edog *)&mtmp->field_0x74;
  stack0xffffffffffffffb0 = (obj *)0x0;
  nx._0_1_ = '\0';
  ndist = -1;
  cursemsg[1] = ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) != 0 ^ 0xffU) & 1;
  cVar1 = mtmp->mx;
  iVar8 = (int)cVar1;
  cVar2 = mtmp->my;
  iVar9 = (int)cVar2;
  if ((cursemsg[1] != 0) && (bVar6 = dog_hunger(mtmp,local_128), bVar6 != '\0')) {
    return 2;
  }
  j = dist2(iVar8,iVar9,(int)u.ux,(int)u.uy);
  if (mtmp == u.usteed) {
    if (((u.uprops[0x15].intrinsic != 0) || (u.uprops[0x15].extrinsic != 0)) &&
       (iVar10 = resist(mtmp,'\x04',0,0), iVar10 == 0)) {
      dismount_steed(2);
      return 1;
    }
    j = 1;
  }
  else if (j == 0) {
    return 0;
  }
  nx._1_1_ = 0;
  allowflags = 0;
  ny._2_1_ = cVar2;
  ny._3_1_ = cVar1;
  if (cursemsg[1] == '\0') {
    i = 0;
  }
  else {
    iVar10 = dog_invent(mtmp,local_128,j);
    if (iVar10 == 2) {
      return 2;
    }
    if (iVar10 == 1) goto LAB_0019ca54;
    i = (int)(moves - *(int *)&mtmp[1].data < 5);
  }
  if (cursemsg[1] == '\0') {
    local_128 = (edog *)0x0;
  }
  iVar10 = dog_goal(mtmp,local_128,after,j,i);
  if (iVar10 == -2) {
    return 0;
  }
  _mstatus = 0x600a0000;
  if ((mtmp->data->mflags1 & 8) != 0) {
    _mstatus = 0x660a0000;
  }
  bVar6 = passes_bars(mtmp->data);
  if ((bVar6 != '\0') || ((mtmp->data->mflags1 & 0x80000000) != 0)) {
    _mstatus = _mstatus | 0x10000000;
  }
  if ((mtmp->data->mflags2 & 0x8000000) != 0) {
    _mstatus = _mstatus | 0x2000000;
  }
  if (((u.uprops[0x15].intrinsic == 0) && (u.uprops[0x15].extrinsic == 0)) ||
     ((iVar11 = resist(mtmp,'\x04',0,0), iVar11 != 0 ||
      (_mstatus = _mstatus | 0x40000, cursemsg[1] != '\0')))) {
    if ((((u.uprops[0x15].intrinsic == 0) && (u.uprops[0x15].extrinsic == 0)) &&
        ((*(uint *)&mtmp->field_0x60 >> 0x15 & 1) == 0)) &&
       ((mtmp == u.ustuck && (bVar6 = sticks(youmonst.data), bVar6 == '\0')))) {
      unstuck(mtmp);
      pline("You get released!");
    }
    if (((mtmp->data->mflags1 & 0x2000) == 0) && (mtmp->data->msize != '\0')) {
      _mstatus = _mstatus | 0x400000;
      poVar15 = m_carrying(mtmp,0xe2);
      if (poVar15 != (obj *)0x0) {
        _mstatus = _mstatus | 0x1000000;
      }
    }
    if ((mtmp->data->mflags2 & 0x4000) != 0) {
      _mstatus = _mstatus | 0x1000000;
    }
    if ((mtmp->data->mflags1 & 0x20) != 0) {
      _mstatus = _mstatus | 0x8000000;
    }
    iVar11 = mfndpos(mtmp,local_98,&allowflags,_mstatus);
    cVar7 = (char)iVar11;
    nidist._2_1_ = '\0';
    for (k = 0; k < cVar7; k = k + 1) {
      iVar11 = (int)poss[(long)k + -4].x;
      iVar12 = (int)poss[(long)k + -4].y;
      if ((((level->monsters[iVar11][iVar12] == (monst *)0x0) ||
           ((*(uint *)&level->monsters[iVar11][iVar12]->field_0x60 >> 9 & 1) != 0)) ||
          ((info[(long)k + -1] & 0x80000U) != 0)) &&
         (bVar6 = cursed_object_at(iVar11,iVar12), bVar6 == '\0')) {
        nidist._2_1_ = nidist._2_1_ + '\x01';
      }
    }
    nidist._1_1_ = '\0';
    ndist = -1;
    local_74 = dist2((int)cVar1,(int)cVar2,(int)gx,(int)gy);
    for (k = 0; k < cVar7; k = k + 1) {
      cVar3 = poss[(long)k + -4].x;
      iVar11 = (int)cVar3;
      cVar4 = poss[(long)k + -4].y;
      iVar12 = (int)cVar4;
      *(undefined1 *)((long)&nx + (long)k + 1) = 0;
      if ((((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) == 0) ||
          (iVar13 = dist2(iVar11,iVar12,(int)u.ux,(int)u.uy), iVar13 < 5)) &&
         ((cursemsg[1] != '\0' ||
          ((iVar13 = dist2(iVar11,iVar12,(int)u.ux,(int)u.uy), iVar13 < 0x11 || (iVar13 < j)))))) {
        if (((info[(long)k + -1] & 0x80000U) == 0) ||
           ((level->monsters[iVar11][iVar12] == (monst *)0x0 ||
            ((*(uint *)&level->monsters[iVar11][iVar12]->field_0x60 >> 9 & 1) != 0)))) {
          if (((info[(long)k + -1] & 0x20000U) != 0) &&
             (ptVar16 = t_at(level,iVar11,iVar12), ptVar16 != (trap *)0x0)) {
            if ((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) == 0) {
              if ((((byte)ptVar16->field_0x8 >> 5 & 1) != 0) && (iVar13 = rn2(0x28), iVar13 != 0))
              goto LAB_0019ca44;
            }
            else if (flags.soundok != '\0') {
              whimper(mtmp);
            }
          }
          if (cursemsg[1] != '\0') {
            for (stack0xffffffffffffffb0 = level->objects[iVar11][iVar12];
                stack0xffffffffffffffb0 != (obj *)0x0;
                stack0xffffffffffffffb0 = (stack0xffffffffffffffb0->v).v_nexthere) {
              if ((*(uint *)&stack0xffffffffffffffb0->field_0x4a & 1) == 0) {
                iVar13 = dogfood(mtmp,stack0xffffffffffffffb0);
                cursemsg[2] = (boolean)iVar13;
                if ((cursemsg[2] < '\x03') &&
                   ((cursemsg[2] < '\x02' || (*(uint *)((long)&mtmp[1].data + 4) <= moves)))) {
                  ndist = k;
                  nx._0_1_ = '\x01';
                  *(undefined1 *)((long)&nx + (long)k + 1) = 0;
                  ny._2_1_ = cVar4;
                  ny._3_1_ = cVar3;
                  goto LAB_0019ca54;
                }
              }
              else {
                *(undefined1 *)((long)&nx + (long)k + 1) = 1;
              }
            }
          }
          if ((((*(char *)((long)&nx + (long)k + 1) == '\0') ||
               ((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) != 0)) || (nidist._2_1_ < '\x01')) ||
             (iVar13 = rn2(nidist._2_1_ * 0xd), iVar13 == 0)) {
            cVar5 = cVar7;
            if (cursemsg[1] != '\0') {
              cVar5 = nidist._2_1_;
            }
            local_134 = (int)cVar5;
            for (local_38 = 0; local_38 < 4 && local_38 < local_134 + -1; local_38 = local_38 + 1) {
              if (((iVar11 == mtmp->mtrack[local_38].x) && (iVar12 == mtmp->mtrack[local_38].y)) &&
                 (iVar13 = rn2((local_134 - local_38) * 4), iVar13 != 0)) goto LAB_0019ca44;
            }
            iVar11 = dist2(iVar11,iVar12,(int)gx,(int)gy);
            iVar12 = (iVar11 - local_74) * iVar10;
            if (iVar12 == 0) {
              nidist._1_1_ = nidist._1_1_ + '\x01';
              iVar13 = rn2((int)nidist._1_1_);
              if (iVar13 != 0) goto LAB_0019c9d8;
            }
            else {
LAB_0019c9d8:
              if ((-1 < iVar12) &&
                 (((iVar12 < 1 || (i != 0)) ||
                  (((iVar8 != ny._3_1_ || ((iVar9 != ny._2_1_ || (iVar13 = rn2(3), iVar13 != 0))))
                   && (iVar13 = rn2(0xc), iVar13 != 0)))))) goto LAB_0019ca44;
            }
            if (iVar12 < 0) {
              nidist._1_1_ = '\0';
            }
            ndist = k;
            local_74 = iVar11;
            ny._2_1_ = cVar4;
            ny._3_1_ = cVar3;
          }
        }
        else {
          if ((level->monsters[iVar11][iVar12] == (monst *)0x0) ||
             ((*(uint *)&level->monsters[iVar11][iVar12]->field_0x60 >> 9 & 1) != 0)) {
            local_130 = (monst *)0x0;
          }
          else {
            local_130 = level->monsters[iVar11][iVar12];
          }
          if (((((uint)local_130->m_lev < mtmp->m_lev + 2) &&
               ((((((local_130->data != mons + 0x1e || (iVar11 = rn2(10), iVar11 == 0)) ||
                   ((*(uint *)&mtmp->field_0x60 >> 0x11 & 1) == 0)) ||
                  (((mtmp->data->mflags1 & 0x1000) != 0 ||
                   ((*(uint *)&local_130->field_0x60 >> 0x11 & 1) == 0)))) ||
                 (((mtmp->data->mflags1 & 0x1000000) == 0 &&
                  ((*(uint *)&local_130->field_0x60 >> 1 & 1) != 0)))) &&
                (((local_130->data != mons + 10 || (iVar11 = rn2(10), iVar11 == 0)) &&
                 (iVar11 = max_passive_dmg(local_130,mtmp), iVar11 < mtmp->mhp)))))) &&
              ((((mtmp->mhpmax <= mtmp->mhp * 4 && (local_130->data->msound != '!')) &&
                (local_130->data->msound != '\x1f')) ||
               ((((*(uint *)&local_130->field_0x60 >> 0x16 & 1) == 0 ||
                 (u.uprops[0x15].intrinsic != 0)) || (u.uprops[0x15].extrinsic != 0)))))) &&
             (((local_130->data != mons + 0xdb || ((mtmp->mintrinsics & 8) != 0)) &&
              (((local_130->data != mons + 0xc && (local_130->data != mons + 0xb)) ||
               ((mtmp->mintrinsics & 0x80) != 0)))))) {
            if (after != 0) {
              return 0;
            }
            notonhead = '\0';
            mtmp2._0_4_ = mattackm(mtmp,local_130);
            if (((uint)mtmp2 & 4) == 0) {
              if ((((((uint)mtmp2 & 1) != 0) && (((uint)mtmp2 & 2) == 0)) &&
                  (iVar8 = rn2(4), iVar8 != 0)) &&
                 (((local_130->mlstmv != moves &&
                   (bVar6 = onscary((int)mtmp->mx,(int)mtmp->my,local_130), bVar6 == '\0')) &&
                  ((bVar6 = monnear(local_130,(int)mtmp->mx,(int)mtmp->my), bVar6 != '\0' &&
                   (uVar14 = mattackm(local_130,mtmp), (uVar14 & 2) != 0)))))) {
                return 2;
              }
              return 0;
            }
            return 2;
          }
        }
      }
LAB_0019ca44:
    }
LAB_0019ca54:
    if ((ny._3_1_ == iVar8) && (ny._2_1_ == iVar9)) {
      if (((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) != 0) &&
         (iVar10 = dist2(iVar8,iVar9,(int)u.ux,(int)u.uy), 4 < iVar10)) {
        iVar8 = sgn(iVar8 - u.ux);
        iVar9 = sgn(iVar9 - u.uy);
        local_112.x = u.ux + (char)iVar8;
        local_112.y = u.uy + (char)iVar9;
        bVar6 = goodpos(level,(int)local_112.x,(int)local_112.y,mtmp,0);
        if (bVar6 == '\0') {
          iVar8 = xytod((char)iVar8,(char)iVar9);
          for (local_38 = (iVar8 + 7) % 8; local_38 < (iVar8 + 1) % 8; local_38 = local_38 + 1) {
            dtoxy(&local_112,local_38);
            bVar6 = goodpos(level,(int)local_112.x,(int)local_112.y,mtmp,0);
            if (bVar6 != '\0') goto LAB_0019d122;
          }
          for (local_38 = (iVar8 + 6) % 8; local_38 < (iVar8 + 2) % 8; local_38 = local_38 + 1) {
            dtoxy(&local_112,local_38);
            bVar6 = goodpos(level,(int)local_112.x,(int)local_112.y,mtmp,0);
            if (bVar6 != '\0') goto LAB_0019d122;
          }
          local_112.x = mtmp->mx;
          local_112.y = mtmp->my;
        }
LAB_0019d122:
        bVar6 = m_in_out_region(mtmp,ny._3_1_,ny._2_1_);
        if (bVar6 == '\0') {
          return 1;
        }
        remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
        place_monster(mtmp,(int)local_112.x,(int)local_112.y);
        newsym((int)local_112.x,(int)local_112.y);
        set_apparxy(level,mtmp);
      }
    }
    else {
      if ((info[(long)ndist + -1] & 0x40000U) != 0) {
        if ((*(uint *)&mtmp->field_0x60 >> 0x18 & 1) != 0) {
          pcVar17 = Monnam(mtmp);
          iVar8 = pronoun_gender(level,mtmp);
          pline("%s breaks loose of %s leash!",pcVar17,genders[iVar8].his);
          m_unleash(mtmp,'\0');
        }
        mattacku(mtmp);
        return 0;
      }
      bVar6 = m_in_out_region(mtmp,ny._3_1_,ny._2_1_);
      if (bVar6 == '\0') {
        return 1;
      }
      if (((((level->locations[ny._3_1_][ny._2_1_].typ < '\x11') &&
            (bVar6 = may_dig(level,ny._3_1_,ny._2_1_), bVar6 != '\0')) ||
           (bVar6 = closed_door(level,(int)ny._3_1_,(int)ny._2_1_), bVar6 != '\0')) &&
          ((mtmp->weapon_check != '\0' && ((mtmp->data->mflags1 & 0x20) != 0)))) &&
         ((mtmp->data->mflags1 & 0x40) != 0)) {
        bVar6 = closed_door(level,(int)ny._3_1_,(int)ny._2_1_);
        if (bVar6 == '\0') {
          if ((level->locations[ny._3_1_][ny._2_1_].typ == '\r') ||
             (((*(uint *)&(level->flags).field_0x8 >> 0x14 & 1) != 0 &&
              (level->locations[ny._3_1_][ny._2_1_].typ == '\0')))) {
            poStack_110 = mtmp->mw;
            if ((poStack_110 == (obj *)0x0) ||
               (((poStack_110->oclass != '\x02' && (poStack_110->oclass != '\x06')) ||
                (objects[poStack_110->otyp].oc_subtyp != '\x03')))) {
              mtmp->weapon_check = '\x05';
            }
          }
          else {
            poStack_110 = mtmp->mw;
            if (((poStack_110 == (obj *)0x0) ||
                ((poStack_110->oclass != '\x02' && (poStack_110->oclass != '\x06')))) ||
               (objects[poStack_110->otyp].oc_subtyp != '\x04')) {
              mtmp->weapon_check = '\x04';
            }
          }
        }
        else {
          poStack_110 = mtmp->mw;
          if (((poStack_110 == (obj *)0x0) ||
              ((poStack_110->oclass != '\x02' && (poStack_110->oclass != '\x06')))) ||
             ((objects[poStack_110->otyp].oc_subtyp != '\x04' ||
              (((poStack_110->oclass != '\x02' && (poStack_110->oclass != '\x06')) ||
               (objects[poStack_110->otyp].oc_subtyp != '\x03')))))) {
            mtmp->weapon_check = '\x06';
          }
        }
        if (('\x03' < mtmp->weapon_check) && (iVar10 = mon_wield_item(mtmp), iVar10 != 0)) {
          return 0;
        }
      }
      remove_monster(level,iVar8,iVar9);
      place_monster(mtmp,(int)ny._3_1_,(int)ny._2_1_);
      if ((*(char *)((long)&nx + (long)ndist + 1) != '\0') &&
         (((viz_array[iVar9][iVar8] & 2U) != 0 || ((viz_array[ny._2_1_][ny._3_1_] & 2U) != 0)))) {
        pcVar17 = Monnam(mtmp);
        pline("%s moves only reluctantly.",pcVar17);
      }
      for (local_38 = 3; 0 < local_38; local_38 = local_38 + -1) {
        mtmp->mtrack[local_38] = mtmp->mtrack[local_38 + -1];
      }
      mtmp->mtrack[0].x = cVar1;
      mtmp->mtrack[0].y = cVar2;
      if (((char)nx != '\0') &&
         (iVar8 = dog_eat(mtmp,stack0xffffffffffffffb0,iVar8,iVar9,'\0'), iVar8 == 2)) {
        return 2;
      }
    }
    return 1;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
        (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))
    goto LAB_0019bcd6;
LAB_0019bd63:
    if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
         ((poVar15 = which_armor(mtmp,4), poVar15 != (obj *)0x0 &&
          (poVar15 = which_armor(mtmp,4), poVar15->otyp == 0x4f)))) ||
        (((((u.uprops[0x1e].intrinsic == 0 &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
          (u.uprops[0x19].blocked != 0)) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar8 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar8)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar6 = match_warn_of_mon(mtmp), bVar6 == '\0')))) goto LAB_0019bf4e;
  }
  else {
    bVar6 = worm_known(level,mtmp);
    if (bVar6 == '\0') goto LAB_0019bd63;
LAB_0019bcd6:
    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
         (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
       ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)
         ) || (((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_0019bd63;
  }
  pcVar17 = Monnam(mtmp);
  pline("%s rebukes you, saying:",pcVar17);
  verbalize("Since you desire conflict, have some more!");
LAB_0019bf4e:
  mongone(mtmp);
  k = rnd(4);
  while (iVar8 = k + -1, k != 0) {
    mtmp2._6_1_ = u.ux;
    mtmp2._7_1_ = u.uy;
    bVar6 = enexto((coord *)((long)&mtmp2 + 6),level,u.ux,u.uy,mons + 0x7f);
    k = iVar8;
    if (bVar6 != '\0') {
      mk_roamer(mons + 0x7f,u.ualign.type,level,mtmp2._6_1_,mtmp2._7_1_,'\0');
    }
  }
  return 2;
}

Assistant:

int dog_move(struct monst *mtmp, 
	     int after)	/* this is extra fast monster movement */
{
	int omx, omy;		/* original mtmp position */
	int appr, whappr, udist;
	int i, j, k;
	struct edog *edog = EDOG(mtmp);
	struct obj *obj = NULL;
	xchar otyp;
	boolean has_edog, cursemsg[9], do_eat = FALSE;
	xchar nix, niy;		/* position mtmp is (considering) moving to */
	int nx, ny;	/* temporary coordinates */
	xchar cnt, uncursedcnt, chcnt;
	int chi = -1, nidist, ndist;
	coord poss[9];
	long info[9], allowflags;
#define GDIST(x,y) (dist2(x,y,gx,gy))

	/*
	 * Tame Angels have isminion set and an ispriest structure instead of
	 * an edog structure.  Fortunately, guardian Angels need not worry
	 * about mundane things like eating and fetching objects, and can
	 * spend all their energy defending the player.  (They are the only
	 * monsters with other structures that can be tame.)
	 */
	has_edog = !mtmp->isminion;

	omx = mtmp->mx;
	omy = mtmp->my;
	if (has_edog && dog_hunger(mtmp, edog)) return 2;	/* starved */

	udist = distu(omx,omy);
	/* Let steeds eat and maybe throw rider during Conflict */
	if (mtmp == u.usteed) {
	    if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
		dismount_steed(DISMOUNT_THROWN);
		return 1;
	    }
	    udist = 1;
	} else if (!udist)
	/* maybe we tamed him while being swallowed --jgm */
		return 0;

	nix = omx;	/* set before newdogpos */
	niy = omy;
	cursemsg[0] = FALSE;	/* lint suppression */
	info[0] = 0;		/* ditto */

	if (has_edog) {
	    j = dog_invent(mtmp, edog, udist);
	    if (j == 2) return 2;		/* died */
	    else if (j == 1) goto newdogpos;	/* eating something */

	    whappr = (moves - edog->whistletime < 5);
	} else
	    whappr = 0;

	appr = dog_goal(mtmp, has_edog ? edog : NULL,
							after, udist, whappr);
	if (appr == -2) return 0;

	allowflags = ALLOW_M | ALLOW_TRAPS | ALLOW_SSM | ALLOW_SANCT;
	if (passes_walls(mtmp->data)) allowflags |= (ALLOW_ROCK | ALLOW_WALL);
	if (passes_bars(mtmp->data) || metallivorous(mtmp->data))
	    allowflags |= ALLOW_BARS;
	if (throws_rocks(mtmp->data)) allowflags |= ALLOW_ROCK;
	if (Conflict && !resist(mtmp, RING_CLASS, 0, 0)) {
	    allowflags |= ALLOW_U;
	    if (!has_edog) {
		coord mm;
		/* Guardian angel refuses to be conflicted; rather,
		 * it disappears, angrily, and sends in some nasties
		 */
		if (canspotmon(level, mtmp)) {
		    pline("%s rebukes you, saying:", Monnam(mtmp));
		    verbalize("Since you desire conflict, have some more!");
		}
		mongone(mtmp);
		i = rnd(4);
		while (i--) {
		    mm.x = u.ux;
		    mm.y = u.uy;
		    if (enexto(&mm, level, mm.x, mm.y, &mons[PM_ANGEL]))
			mk_roamer(&mons[PM_ANGEL], u.ualign.type,
					 level, mm.x, mm.y, FALSE);
		}
		return 2;

	    }
	}
	if (!Conflict && !mtmp->mconf &&
	    mtmp == u.ustuck && !sticks(youmonst.data)) {
	    unstuck(mtmp);	/* swallowed case handled above */
	    pline("You get released!");
	}
	if (!nohands(mtmp->data) && !verysmall(mtmp->data)) {
		allowflags |= OPENDOOR;
		if (m_carrying(mtmp, SKELETON_KEY)) allowflags |= BUSTDOOR;
	}
	if (is_giant(mtmp->data)) allowflags |= BUSTDOOR;
	if (tunnels(mtmp->data)) allowflags |= ALLOW_DIG;
	cnt = mfndpos(mtmp, poss, info, allowflags);

	/* Normally dogs don't step on cursed items, but if they have no
	 * other choice they will.  This requires checking ahead of time
	 * to see how many uncursed item squares are around.
	 */
	uncursedcnt = 0;
	for (i = 0; i < cnt; i++) {
		nx = poss[i].x; ny = poss[i].y;
		if (MON_AT(level, nx,ny) && !(info[i] & ALLOW_M)) continue;
		if (cursed_object_at(nx, ny)) continue;
		uncursedcnt++;
	}

	chcnt = 0;
	chi = -1;
	nidist = GDIST(nix,niy);

	for (i = 0; i < cnt; i++) {
		nx = poss[i].x;
		ny = poss[i].y;
		cursemsg[i] = FALSE;

		/* if leashed, we drag him along. */
		if (mtmp->mleashed && distu(nx, ny) > 4) continue;

		/* if a guardian, try to stay close by choice */
		if (!has_edog &&
		    (j = distu(nx, ny)) > 16 && j >= udist) continue;

		if ((info[i] & ALLOW_M) && MON_AT(level, nx, ny)) {
		    int mstatus;
		    struct monst *mtmp2 = m_at(level, nx,ny);

		    if ((int)mtmp2->m_lev >= (int)mtmp->m_lev+2 ||
			(mtmp2->data == &mons[PM_FLOATING_EYE] && rn2(10) &&
			 mtmp->mcansee && haseyes(mtmp->data) && mtmp2->mcansee
			 && (perceives(mtmp->data) || !mtmp2->minvis)) ||
			(mtmp2->data==&mons[PM_GELATINOUS_CUBE] && rn2(10)) ||
			(max_passive_dmg(mtmp2, mtmp) >= mtmp->mhp) ||
			((mtmp->mhp*4 < mtmp->mhpmax
			  || mtmp2->data->msound == MS_GUARDIAN
			  || mtmp2->data->msound == MS_LEADER) &&
			 mtmp2->mpeaceful && !Conflict) ||
			(touch_disintegrates(mtmp2->data) &&
			 !resists_disint(mtmp)) ||
			(touch_petrifies(mtmp2->data) &&
			 !resists_ston(mtmp)))
			continue;

		    if (after) return 0; /* hit only once each move */

		    notonhead = 0;
		    mstatus = mattackm(mtmp, mtmp2);

		    /* aggressor (pet) died */
		    if (mstatus & MM_AGR_DIED) return 2;

		    if ((mstatus & MM_HIT) && !(mstatus & MM_DEF_DIED) &&
			    rn2(4) && mtmp2->mlstmv != moves &&
			    !onscary(mtmp->mx, mtmp->my, mtmp2) &&
			    /* monnear check needed: long worms hit on tail */
			    monnear(mtmp2, mtmp->mx, mtmp->my)) {
			mstatus = mattackm(mtmp2, mtmp);  /* return attack */
			if (mstatus & MM_DEF_DIED) return 2;
		    }

		    return 0;
		}

		{   /* Dog avoids harmful traps, but perhaps it has to pass one
		     * in order to follow player.  (Non-harmful traps do not
		     * have ALLOW_TRAPS in info[].)  The dog only avoids the
		     * trap if you've seen it, unlike enemies who avoid traps
		     * if they've seen some trap of that type sometime in the
		     * past.  (Neither behavior is really realistic.)
		     */
		    struct trap *trap;

		    if ((info[i] & ALLOW_TRAPS) && (trap = t_at(level, nx, ny))) {
			if (mtmp->mleashed) {
			    if (flags.soundok) whimper(mtmp);
			} else
			    /* 1/40 chance of stepping on it anyway, in case
			     * it has to pass one to follow the player...
			     */
			    if (trap->tseen && rn2(40)) continue;
		    }
		}

		/* dog eschews cursed objects, but likes dog food */
		/* (minion isn't interested; `cursemsg' stays FALSE) */
		if (has_edog)
		for (obj = level->objects[nx][ny]; obj; obj = obj->nexthere) {
		    if (obj->cursed) cursemsg[i] = TRUE;
		    else if ((otyp = dogfood(mtmp, obj)) < MANFOOD &&
			     (otyp < ACCFOOD || edog->hungrytime <= moves)) {
			/* Note: our dog likes the food so much that he
			 * might eat it even when it conceals a cursed object */
			nix = nx;
			niy = ny;
			chi = i;
			do_eat = TRUE;
			cursemsg[i] = FALSE;	/* not reluctant */
			goto newdogpos;
		    }
		}
		/* didn't find something to eat; if we saw a cursed item and
		   aren't being forced to walk on it, usually keep looking */
		if (cursemsg[i] && !mtmp->mleashed && uncursedcnt > 0 &&
		    rn2(13 * uncursedcnt)) continue;

		/* lessen the chance of backtracking to previous position(s) */
		k = has_edog ? uncursedcnt : cnt;
		for (j = 0; j < MTSZ && j < k - 1; j++)
			if (nx == mtmp->mtrack[j].x && ny == mtmp->mtrack[j].y)
				if (rn2(MTSZ * (k - j))) goto nxti;

		j = ((ndist = GDIST(nx,ny)) - nidist) * appr;
		if ((j == 0 && !rn2(++chcnt)) || j < 0 ||
			(j > 0 && !whappr &&
				((omx == nix && omy == niy && !rn2(3))
					|| !rn2(12))
			)) {
			nix = nx;
			niy = ny;
			nidist = ndist;
			if (j < 0) chcnt = 0;
			chi = i;
		}
	nxti:	;
	}
newdogpos:
	if (nix != omx || niy != omy) {
		struct obj *mw_tmp;

		if (info[chi] & ALLOW_U) {
			if (mtmp->mleashed) { /* play it safe */
				pline("%s breaks loose of %s leash!",
				      Monnam(mtmp), mhis(level, mtmp));
				m_unleash(mtmp, FALSE);
			}
			mattacku(mtmp);
			return 0;
		}
		if (!m_in_out_region(mtmp, nix, niy))
		    return 1;
		if (((IS_ROCK(level->locations[nix][niy].typ) && may_dig(level, nix,niy)) ||
		     closed_door(level, nix, niy)) &&
		    mtmp->weapon_check != NO_WEAPON_WANTED &&
		    tunnels(mtmp->data) && needspick(mtmp->data)) {
		    if (closed_door(level, nix, niy)) {
			if (!(mw_tmp = MON_WEP(mtmp)) ||
			    !is_pick(mw_tmp) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_PICK_OR_AXE;
		    } else if (IS_TREE(level, level->locations[nix][niy].typ)) {
			if (!(mw_tmp = MON_WEP(mtmp)) || !is_axe(mw_tmp))
			    mtmp->weapon_check = NEED_AXE;
		    } else if (!(mw_tmp = MON_WEP(mtmp)) || !is_pick(mw_tmp)) {
			mtmp->weapon_check = NEED_PICK_AXE;
		    }
		    if (mtmp->weapon_check >= NEED_PICK_AXE &&
			mon_wield_item(mtmp))
			return 0;
		}
		/* insert a worm_move() if worms ever begin to eat things */
		remove_monster(level, omx, omy);
		place_monster(mtmp, nix, niy);
		if (cursemsg[chi] && (cansee(omx,omy) || cansee(nix,niy)))
			pline("%s moves only reluctantly.", Monnam(mtmp));
		for (j=MTSZ-1; j>0; j--) mtmp->mtrack[j] = mtmp->mtrack[j-1];
		mtmp->mtrack[0].x = omx;
		mtmp->mtrack[0].y = omy;
		/* We have to know if the pet's gonna do a combined eat and
		 * move before moving it, but it can't eat until after being
		 * moved.  Thus the do_eat flag.
		 */
		if (do_eat) {
		    if (dog_eat(mtmp, obj, omx, omy, FALSE) == 2) return 2;
		}
	} else if (mtmp->mleashed && distu(omx, omy) > 4) {
		/* an incredible kludge, but the only way to keep pooch near
		 * after it spends time eating or in a trap, etc.
		 */
		coord cc;

		nx = sgn(omx - u.ux);
		ny = sgn(omy - u.uy);
		cc.x = u.ux + nx;
		cc.y = u.uy + ny;
		if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;

		i  = xytod(nx, ny);
		for (j = (i + 7)%8; j < (i + 1)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		for (j = (i + 6)%8; j < (i + 2)%8; j++) {
			dtoxy(&cc, j);
			if (goodpos(level, cc.x, cc.y, mtmp, 0)) goto dognext;
		}
		cc.x = mtmp->mx;
		cc.y = mtmp->my;
dognext:
		if (!m_in_out_region(mtmp, nix, niy))
		  return 1;
		remove_monster(level, mtmp->mx, mtmp->my);
		place_monster(mtmp, cc.x, cc.y);
		newsym(cc.x,cc.y);
		set_apparxy(level, mtmp);
	}
	return 1;
}